

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_tf_mt_dealloc(AV1TemporalFilterSync *tf_sync)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    pthread_mutex_destroy((pthread_mutex_t *)*in_RDI);
    aom_free(tf_sync);
  }
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void av1_tf_mt_dealloc(AV1TemporalFilterSync *tf_sync) {
  assert(tf_sync != NULL);
#if CONFIG_MULTITHREAD
  if (tf_sync->mutex_ != NULL) {
    pthread_mutex_destroy(tf_sync->mutex_);
    aom_free(tf_sync->mutex_);
  }
#endif  // CONFIG_MULTITHREAD
  tf_sync->next_tf_row = 0;
}